

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_clean_whitespaces(char *str_in)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  
  pcVar4 = str_in + -1;
  do {
    pcVar1 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
  } while (*pcVar1 == ' ');
  do {
    bVar3 = true;
    for (; *pcVar4 == ' '; pcVar4 = pcVar4 + 1) {
      bVar3 = false;
    }
    if (*pcVar4 == '\0') {
      *str_in = '\0';
      bVar3 = false;
    }
    else {
      if (!bVar3) {
        *str_in = ' ';
        str_in = str_in + 1;
      }
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
      *str_in = cVar2;
      str_in = str_in + 1;
      bVar3 = true;
    }
  } while (bVar3);
  return;
}

Assistant:

void str_clean_whitespaces(char *str_in)
{
	char *read = str_in;
	char *write = str_in;

	/* skip initial whitespace */
	while(*read == ' ')
		read++;

	/* end of read string is detected in the loop */
	while(1)
	{
		/* skip whitespace */
		int found_whitespace = 0;
		for(; *read == ' '; read++)
			found_whitespace = 1;
		/* if not at the end of the string, put a found whitespace here */
		if(*read)
		{
			if(found_whitespace)
				*write++ = ' ';
			*write++ = *read++;
		}
		else
		{
			*write = 0;
			break;
		}
	}
}